

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O2

bool canMergeFromBelow(QRect *top,QRect *bottom,QRect *nextToTop,QRect *nextToBottom)

{
  int iVar1;
  
  if ((nextToTop == (QRect *)0x0) || ((nextToTop->y1).m_i != (top->y1).m_i)) {
    if (nextToBottom == (QRect *)0x0) {
      iVar1 = (bottom->y1).m_i;
    }
    else {
      iVar1 = (bottom->y1).m_i;
      if ((nextToBottom->y1).m_i == iVar1) {
        return false;
      }
    }
    if ((iVar1 + -1 <= (top->y2).m_i) && ((top->x1).m_i == (bottom->x1).m_i)) {
      return (top->x2).m_i == (bottom->x2).m_i;
    }
  }
  return false;
}

Assistant:

static inline bool canMergeFromBelow(const QRect *top, const QRect *bottom,
                                     const QRect *nextToTop,
                                     const QRect *nextToBottom)
{
    if (nextToTop && nextToTop->y() == top->y())
        return false;
    if (nextToBottom && nextToBottom->y() == bottom->y())
        return false;

    return ((top->bottom() >= (bottom->top() - 1))
            && top->left() == bottom->left()
            && top->right() == bottom->right());
}